

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawList::AddPolyline
          (ImDrawList *this,ImVec2 *points,int points_count,ImU32 col,bool closed,float thickness)

{
  float *pfVar1;
  float *pfVar2;
  undefined8 uVar3;
  ImVec2 IVar4;
  ImVec2 IVar5;
  long lVar6;
  ulong uVar7;
  undefined8 *puVar8;
  ImVec2 *pIVar9;
  ImDrawIdx IVar10;
  ImDrawVert *pIVar11;
  ulong uVar12;
  ImDrawIdx IVar13;
  int iVar14;
  ulong uVar15;
  ImDrawIdx IVar16;
  int iVar17;
  ImDrawIdx *pIVar18;
  undefined7 in_register_00000081;
  ulong uVar19;
  ImDrawIdx IVar20;
  uint uVar21;
  ImDrawIdx IVar22;
  uint uVar23;
  bool bVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float afStack_88 [2];
  undefined8 uStack_80;
  ImVec2 IStack_78;
  undefined8 local_70;
  float local_68 [4];
  ulong local_58;
  int local_4c;
  ImVec2 local_48;
  uint local_3c;
  ulong local_38;
  
  if (points_count < 2) {
    return;
  }
  IVar4 = this->_Data->TexUvWhitePixel;
  local_58 = (ulong)(points_count - 1U);
  local_38 = (ulong)(points_count - 1U);
  if (closed) {
    local_38 = (ulong)(uint)points_count;
  }
  iVar17 = (int)local_38;
  local_68[0] = thickness;
  if ((this->Flags & 1) == 0) {
    uStack_80 = 0x2f91a5;
    PrimReserve(this,iVar17 * 6,iVar17 * 4);
    uVar12 = 1;
    do {
      uVar7 = uVar12 & 0xffffffff;
      if ((uint)points_count == uVar12) {
        uVar7 = 0;
      }
      fVar27 = points[uVar12 - 1].x;
      fVar31 = points[uVar12 - 1].y;
      fVar25 = points[uVar7].x - fVar27;
      fVar28 = points[uVar7].y - fVar31;
      fVar26 = fVar25 * fVar25 + fVar28 * fVar28;
      if (0.0 < fVar26) {
        fVar26 = 1.0 / SQRT(fVar26);
        fVar28 = fVar28 * fVar26;
        fVar25 = fVar25 * fVar26;
      }
      fVar28 = fVar28 * local_68[0] * 0.5;
      fVar25 = fVar25 * local_68[0] * 0.5;
      pIVar11 = this->_VtxWritePtr;
      IVar5.y = fVar31 - fVar25;
      IVar5.x = fVar27 + fVar28;
      pIVar11->pos = IVar5;
      pIVar11->uv = IVar4;
      pIVar11 = this->_VtxWritePtr;
      pIVar11->col = col;
      pIVar11[1].pos.x = points[uVar7].x + fVar28;
      pIVar11[1].pos.y = points[uVar7].y - fVar25;
      pIVar11[1].uv = IVar4;
      pIVar11 = this->_VtxWritePtr;
      pIVar11[1].col = col;
      pIVar11[2].pos.x = points[uVar7].x - fVar28;
      pIVar11[2].pos.y = points[uVar7].y + fVar25;
      pIVar11[2].uv = IVar4;
      pIVar11 = this->_VtxWritePtr;
      pIVar11[2].col = col;
      pIVar11[3].pos.x = points[uVar12 - 1].x - fVar28;
      pIVar11[3].pos.y = points[uVar12 - 1].y + fVar25;
      pIVar11[3].uv = IVar4;
      pIVar11 = this->_VtxWritePtr;
      pIVar11[3].col = col;
      this->_VtxWritePtr = pIVar11 + 4;
      uVar21 = this->_VtxCurrentIdx;
      pIVar18 = this->_IdxWritePtr;
      IVar16 = (ImDrawIdx)uVar21;
      *pIVar18 = IVar16;
      pIVar18[1] = IVar16 + 1;
      pIVar18[2] = IVar16 + 2;
      pIVar18[3] = IVar16;
      pIVar18[4] = IVar16 + 2;
      pIVar18[5] = IVar16 + 3;
      this->_IdxWritePtr = pIVar18 + 6;
      this->_VtxCurrentIdx = uVar21 + 4;
      bVar24 = uVar12 != (local_38 & 0xffffffff);
      uVar12 = uVar12 + 1;
    } while (bVar24);
    return;
  }
  local_48.x = (float)(int)CONCAT71(in_register_00000081,closed);
  local_3c = col & 0xffffff;
  local_70 = (ulong)(1.0 < thickness);
  iVar14 = 0xc;
  if (1.0 < thickness) {
    iVar14 = 0x12;
  }
  local_4c = points_count * 3;
  if (1.0 < thickness) {
    local_4c = points_count * 4;
  }
  uStack_80 = 0x2f937a;
  PrimReserve(this,iVar14 * iVar17,local_4c);
  lVar6 = -((ulong)(uint)(((int)local_70 * 2 + 3) * points_count) * 8 + 0xf & 0xfffffffffffffff0);
  puVar8 = (undefined8 *)((long)&IStack_78 + lVar6);
  uVar7 = (ulong)(uint)points_count;
  pfVar1 = (float *)(puVar8 + uVar7);
  uVar15 = local_38 & 0xffffffff;
  uVar12 = 1;
  do {
    uVar19 = uVar12 & 0xffffffff;
    if (uVar7 == uVar12) {
      uVar19 = 0;
    }
    fVar28 = points[uVar19].x - points[uVar12 - 1].x;
    fVar25 = points[uVar19].y - points[uVar12 - 1].y;
    fVar27 = fVar28 * fVar28 + fVar25 * fVar25;
    if (0.0 < fVar27) {
      fVar27 = 1.0 / SQRT(fVar27);
      fVar28 = fVar28 * fVar27;
      fVar25 = fVar25 * fVar27;
    }
    *(float *)((long)&uStack_80 + uVar12 * 8 + lVar6) = fVar25;
    *(float *)((long)&uStack_80 + uVar12 * 8 + lVar6 + 4) = -fVar28;
    bVar24 = uVar12 != uVar15;
    uVar12 = uVar12 + 1;
  } while (bVar24);
  if (local_48.x._0_1_ == '\0') {
    *(undefined8 *)(pfVar1 + -2) = *(undefined8 *)(pfVar1 + -4);
    if (local_68[0] <= 1.0) {
      fVar28 = (float)*puVar8;
      fVar25 = (float)((ulong)*puVar8 >> 0x20);
      fVar27 = (*points).x;
      fVar31 = (*points).y;
      *pfVar1 = fVar28 + fVar27;
      pfVar1[1] = fVar25 + fVar31;
      pfVar1[2] = fVar27 - fVar28;
      pfVar1[3] = fVar31 - fVar25;
      uVar12 = local_58 & 0xffffffff;
      fVar28 = points[uVar12].x;
      fVar25 = points[uVar12].y;
      uVar19 = (ulong)(uint)((int)local_58 * 2);
      *(ulong *)(pfVar1 + uVar19 * 2) =
           CONCAT44((float)((ulong)puVar8[uVar12] >> 0x20) + fVar25,(float)puVar8[uVar12] + fVar28);
      *(ulong *)(pfVar1 + uVar19 * 2 + 2) =
           CONCAT44(fVar25 - (float)((ulong)puVar8[uVar12] >> 0x20),fVar28 - (float)puVar8[uVar12]);
      goto LAB_002f9760;
    }
    local_48 = IVar4;
    local_38 = CONCAT44(local_38._4_4_,col);
    fVar32 = (local_68[0] + -1.0) * 0.5;
    fVar28 = fVar32 + 1.0;
    fVar25 = (float)*puVar8;
    fVar27 = (float)((ulong)*puVar8 >> 0x20);
    fVar31 = fVar25 * fVar28;
    fVar26 = fVar27 * fVar28;
    fVar29 = (*points).x;
    fVar30 = (*points).y;
    fVar25 = fVar25 * fVar32;
    fVar27 = fVar27 * fVar32;
    *pfVar1 = fVar31 + fVar29;
    pfVar1[1] = fVar26 + fVar30;
    pfVar1[2] = fVar25 + fVar29;
    pfVar1[3] = fVar27 + fVar30;
    pfVar1[4] = fVar29 - fVar25;
    pfVar1[5] = fVar30 - fVar27;
    pfVar1[6] = fVar29 - fVar31;
    pfVar1[7] = fVar30 - fVar26;
    uVar12 = local_58 & 0xffffffff;
    fVar25 = points[uVar12].x;
    fVar27 = points[uVar12].y;
    uVar19 = (ulong)(uint)((int)local_58 << 2);
    *(ulong *)(pfVar1 + uVar19 * 2) =
         CONCAT44((float)((ulong)puVar8[uVar12] >> 0x20) * fVar28 + fVar27,
                  (float)puVar8[uVar12] * fVar28 + fVar25);
    *(ulong *)(pfVar1 + uVar19 * 2 + 2) =
         CONCAT44((float)((ulong)puVar8[uVar12] >> 0x20) * fVar32 + fVar27,
                  (float)puVar8[uVar12] * fVar32 + fVar25);
    *(ulong *)(pfVar1 + uVar19 * 2 + 4) =
         CONCAT44(fVar27 - (float)((ulong)puVar8[uVar12] >> 0x20) * fVar32,
                  fVar25 - (float)puVar8[uVar12] * fVar32);
    *(ulong *)(pfVar1 + uVar19 * 2 + 6) =
         CONCAT44(fVar27 - (float)((ulong)puVar8[uVar12] >> 0x20) * fVar28,
                  fVar25 - (float)puVar8[uVar12] * fVar28);
  }
  else {
    if (local_68[0] <= 1.0) {
LAB_002f9760:
      pIVar18 = this->_IdxWritePtr;
      uVar12 = 1;
      uVar21 = this->_VtxCurrentIdx;
      do {
        uVar19 = uVar12 & 0xffffffff;
        if (uVar7 == uVar12) {
          uVar19 = 0;
        }
        uVar3 = *(undefined8 *)((long)&uStack_80 + uVar12 * 8 + lVar6);
        fVar28 = ((float)puVar8[uVar19] + (float)uVar3) * 0.5;
        fVar25 = ((float)((ulong)puVar8[uVar19] >> 0x20) + (float)((ulong)uVar3 >> 0x20)) * 0.5;
        fVar27 = fVar28 * fVar28 + fVar25 * fVar25;
        uVar23 = uVar21 + 3;
        if (uVar7 == uVar12) {
          uVar23 = this->_VtxCurrentIdx;
        }
        fVar31 = 0.5;
        if (0.5 <= fVar27) {
          fVar31 = fVar27;
        }
        fVar27 = points[uVar19].x;
        fVar26 = points[uVar19].y;
        fVar28 = (1.0 / fVar31) * fVar28;
        fVar25 = (1.0 / fVar31) * fVar25;
        pfVar2 = pfVar1 + (ulong)(uint)((int)uVar19 * 2) * 2;
        *pfVar2 = fVar28 + fVar27;
        pfVar2[1] = fVar25 + fVar26;
        pfVar2[2] = fVar27 - fVar28;
        pfVar2[3] = fVar26 - fVar25;
        IVar22 = (ImDrawIdx)uVar23;
        *pIVar18 = IVar22;
        IVar16 = (ImDrawIdx)uVar21;
        pIVar18[1] = IVar16;
        pIVar18[2] = IVar16 + 2;
        pIVar18[3] = IVar16 + 2;
        pIVar18[4] = IVar22 + 2;
        pIVar18[5] = IVar22;
        pIVar18[6] = IVar22 + 1;
        pIVar18[7] = IVar16 + 1;
        pIVar18[8] = IVar16;
        pIVar18[9] = IVar16;
        pIVar18[10] = IVar22;
        pIVar18[0xb] = IVar22 + 1;
        pIVar18 = pIVar18 + 0xc;
        bVar24 = uVar12 != uVar15;
        uVar12 = uVar12 + 1;
        uVar21 = uVar23;
      } while (bVar24);
      this->_IdxWritePtr = pIVar18;
      pIVar11 = this->_VtxWritePtr;
      pIVar9 = (ImVec2 *)(puVar8 + uVar7 + 1);
      uVar12 = 0;
      do {
        pIVar11->pos = points[uVar12];
        this->_VtxWritePtr->uv = IVar4;
        pIVar11 = this->_VtxWritePtr;
        pIVar11->col = col;
        pIVar11[1].pos = pIVar9[-1];
        this->_VtxWritePtr[1].uv = IVar4;
        pIVar11 = this->_VtxWritePtr;
        pIVar11[1].col = local_3c;
        pIVar11[2].pos = *pIVar9;
        this->_VtxWritePtr[2].uv = IVar4;
        pIVar11 = this->_VtxWritePtr;
        pIVar11[2].col = local_3c;
        pIVar11 = pIVar11 + 3;
        this->_VtxWritePtr = pIVar11;
        uVar12 = uVar12 + 1;
        pIVar9 = pIVar9 + 2;
      } while (uVar7 != uVar12);
      goto LAB_002f98cc;
    }
    local_48 = IVar4;
    local_38 = CONCAT44(local_38._4_4_,col);
    fVar32 = (local_68[0] + -1.0) * 0.5;
  }
  pIVar18 = this->_IdxWritePtr;
  uVar12 = 1;
  uVar21 = this->_VtxCurrentIdx;
  do {
    uVar19 = uVar12 & 0xffffffff;
    if (uVar7 == uVar12) {
      uVar19 = 0;
    }
    uVar3 = *(undefined8 *)((long)&uStack_80 + uVar12 * 8 + lVar6);
    fVar25 = ((float)puVar8[uVar19] + (float)uVar3) * 0.5;
    fVar27 = ((float)((ulong)puVar8[uVar19] >> 0x20) + (float)((ulong)uVar3 >> 0x20)) * 0.5;
    fVar31 = fVar25 * fVar25 + fVar27 * fVar27;
    fVar28 = 0.5;
    if (0.5 <= fVar31) {
      fVar28 = fVar31;
    }
    uVar23 = uVar21 + 4;
    if (uVar7 == uVar12) {
      uVar23 = this->_VtxCurrentIdx;
    }
    fVar28 = 1.0 / fVar28;
    fVar29 = points[uVar19].x;
    fVar30 = points[uVar19].y;
    fVar31 = fVar25 * fVar28 * (fVar32 + 1.0);
    fVar26 = fVar27 * fVar28 * (fVar32 + 1.0);
    fVar25 = fVar25 * fVar28 * fVar32;
    fVar28 = fVar27 * fVar28 * fVar32;
    uVar19 = (ulong)(uint)((int)uVar19 << 2);
    pfVar2 = pfVar1 + uVar19 * 2;
    *pfVar2 = fVar29 + fVar31;
    pfVar2[1] = fVar30 + fVar26;
    pfVar2[2] = fVar29 + fVar25;
    pfVar2[3] = fVar30 + fVar28;
    IVar16 = (ImDrawIdx)uVar23;
    IVar20 = IVar16 + 1;
    pfVar2 = pfVar1 + uVar19 * 2 + 4;
    *pfVar2 = fVar29 - fVar25;
    pfVar2[1] = fVar30 - fVar28;
    pfVar2[2] = fVar29 - fVar31;
    pfVar2[3] = fVar30 - fVar26;
    *pIVar18 = IVar20;
    IVar22 = (ImDrawIdx)uVar21;
    IVar13 = IVar22 + 2;
    pIVar18[1] = IVar22 + 1;
    pIVar18[2] = IVar13;
    pIVar18[3] = IVar13;
    IVar10 = IVar16 + 2;
    pIVar18[4] = IVar10;
    pIVar18[5] = IVar20;
    pIVar18[6] = IVar20;
    pIVar18[7] = IVar22 + 1;
    pIVar18[8] = IVar22;
    pIVar18[9] = IVar22;
    pIVar18[10] = IVar16;
    pIVar18[0xb] = IVar20;
    pIVar18[0xc] = IVar10;
    pIVar18[0xd] = IVar13;
    pIVar18[0xe] = IVar22 + 3;
    pIVar18[0xf] = IVar22 + 3;
    pIVar18[0x10] = IVar16 + 3;
    pIVar18[0x11] = IVar10;
    pIVar18 = pIVar18 + 0x12;
    bVar24 = uVar12 != uVar15;
    uVar12 = uVar12 + 1;
    uVar21 = uVar23;
  } while (bVar24);
  this->_IdxWritePtr = pIVar18;
  pIVar11 = this->_VtxWritePtr;
  pIVar9 = (ImVec2 *)(puVar8 + uVar7 + 3);
  do {
    pIVar11->pos = pIVar9[-3];
    this->_VtxWritePtr->uv = local_48;
    pIVar11 = this->_VtxWritePtr;
    pIVar11->col = local_3c;
    pIVar11[1].pos = pIVar9[-2];
    this->_VtxWritePtr[1].uv = local_48;
    pIVar11 = this->_VtxWritePtr;
    pIVar11[1].col = (ImU32)local_38;
    pIVar11[2].pos = pIVar9[-1];
    this->_VtxWritePtr[2].uv = local_48;
    pIVar11 = this->_VtxWritePtr;
    pIVar11[2].col = (ImU32)local_38;
    pIVar11[3].pos = *pIVar9;
    this->_VtxWritePtr[3].uv = local_48;
    pIVar11 = this->_VtxWritePtr;
    pIVar11[3].col = local_3c;
    pIVar11 = pIVar11 + 4;
    this->_VtxWritePtr = pIVar11;
    pIVar9 = pIVar9 + 4;
    uVar7 = uVar7 - 1;
  } while (uVar7 != 0);
LAB_002f98cc:
  this->_VtxCurrentIdx = this->_VtxCurrentIdx + (uint)(ushort)local_4c;
  return;
}

Assistant:

void ImDrawList::AddPolyline(const ImVec2* points, const int points_count, ImU32 col, bool closed, float thickness)
{
    if (points_count < 2)
        return;

    const ImVec2 uv = _Data->TexUvWhitePixel;

    int count = points_count;
    if (!closed)
        count = points_count-1;

    const bool thick_line = thickness > 1.0f;
    if (Flags & ImDrawListFlags_AntiAliasedLines)
    {
        // Anti-aliased stroke
        const float AA_SIZE = 1.0f;
        const ImU32 col_trans = col & ~IM_COL32_A_MASK;

        const int idx_count = thick_line ? count*18 : count*12;
        const int vtx_count = thick_line ? points_count*4 : points_count*3;
        PrimReserve(idx_count, vtx_count);

        // Temporary buffer
        ImVec2* temp_normals = (ImVec2*)alloca(points_count * (thick_line ? 5 : 3) * sizeof(ImVec2)); //-V630
        ImVec2* temp_points = temp_normals + points_count;

        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1+1) == points_count ? 0 : i1+1;
            float dx = points[i2].x - points[i1].x;
            float dy = points[i2].y - points[i1].y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            temp_normals[i1].x = dy;
            temp_normals[i1].y = -dx;
        }
        if (!closed)
            temp_normals[points_count-1] = temp_normals[points_count-2];

        if (!thick_line)
        {
            if (!closed)
            {
                temp_points[0] = points[0] + temp_normals[0] * AA_SIZE;
                temp_points[1] = points[0] - temp_normals[0] * AA_SIZE;
                temp_points[(points_count-1)*2+0] = points[points_count-1] + temp_normals[points_count-1] * AA_SIZE;
                temp_points[(points_count-1)*2+1] = points[points_count-1] - temp_normals[points_count-1] * AA_SIZE;
            }

            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx;
            for (int i1 = 0; i1 < count; i1++)
            {
                const int i2 = (i1+1) == points_count ? 0 : i1+1;
                unsigned int idx2 = (i1+1) == points_count ? _VtxCurrentIdx : idx1+3;

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_FIXNORMAL2F(dm_x, dm_y)
                dm_x *= AA_SIZE;
                dm_y *= AA_SIZE;

                // Add temporary vertexes
                ImVec2* out_vtx = &temp_points[i2*2];
                out_vtx[0].x = points[i2].x + dm_x;
                out_vtx[0].y = points[i2].y + dm_y;
                out_vtx[1].x = points[i2].x - dm_x;
                out_vtx[1].y = points[i2].y - dm_y;

                // Add indexes
                _IdxWritePtr[0] = (ImDrawIdx)(idx2+0); _IdxWritePtr[1] = (ImDrawIdx)(idx1+0); _IdxWritePtr[2] = (ImDrawIdx)(idx1+2);
                _IdxWritePtr[3] = (ImDrawIdx)(idx1+2); _IdxWritePtr[4] = (ImDrawIdx)(idx2+2); _IdxWritePtr[5] = (ImDrawIdx)(idx2+0);
                _IdxWritePtr[6] = (ImDrawIdx)(idx2+1); _IdxWritePtr[7] = (ImDrawIdx)(idx1+1); _IdxWritePtr[8] = (ImDrawIdx)(idx1+0);
                _IdxWritePtr[9] = (ImDrawIdx)(idx1+0); _IdxWritePtr[10]= (ImDrawIdx)(idx2+0); _IdxWritePtr[11]= (ImDrawIdx)(idx2+1);
                _IdxWritePtr += 12;

                idx1 = idx2;
            }

            // Add vertexes
            for (int i = 0; i < points_count; i++)
            {
                _VtxWritePtr[0].pos = points[i];          _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;
                _VtxWritePtr[1].pos = temp_points[i*2+0]; _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col_trans;
                _VtxWritePtr[2].pos = temp_points[i*2+1]; _VtxWritePtr[2].uv = uv; _VtxWritePtr[2].col = col_trans;
                _VtxWritePtr += 3;
            }
        }
        else
        {
            const float half_inner_thickness = (thickness - AA_SIZE) * 0.5f;
            if (!closed)
            {
                temp_points[0] = points[0] + temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[1] = points[0] + temp_normals[0] * (half_inner_thickness);
                temp_points[2] = points[0] - temp_normals[0] * (half_inner_thickness);
                temp_points[3] = points[0] - temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[(points_count-1)*4+0] = points[points_count-1] + temp_normals[points_count-1] * (half_inner_thickness + AA_SIZE);
                temp_points[(points_count-1)*4+1] = points[points_count-1] + temp_normals[points_count-1] * (half_inner_thickness);
                temp_points[(points_count-1)*4+2] = points[points_count-1] - temp_normals[points_count-1] * (half_inner_thickness);
                temp_points[(points_count-1)*4+3] = points[points_count-1] - temp_normals[points_count-1] * (half_inner_thickness + AA_SIZE);
            }

            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx;
            for (int i1 = 0; i1 < count; i1++)
            {
                const int i2 = (i1+1) == points_count ? 0 : i1+1;
                unsigned int idx2 = (i1+1) == points_count ? _VtxCurrentIdx : idx1+4;

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_FIXNORMAL2F(dm_x, dm_y);
                float dm_out_x = dm_x * (half_inner_thickness + AA_SIZE);
                float dm_out_y = dm_y * (half_inner_thickness + AA_SIZE);
                float dm_in_x = dm_x * half_inner_thickness;
                float dm_in_y = dm_y * half_inner_thickness;

                // Add temporary vertexes
                ImVec2* out_vtx = &temp_points[i2*4];
                out_vtx[0].x = points[i2].x + dm_out_x;
                out_vtx[0].y = points[i2].y + dm_out_y;
                out_vtx[1].x = points[i2].x + dm_in_x;
                out_vtx[1].y = points[i2].y + dm_in_y;
                out_vtx[2].x = points[i2].x - dm_in_x;
                out_vtx[2].y = points[i2].y - dm_in_y;
                out_vtx[3].x = points[i2].x - dm_out_x;
                out_vtx[3].y = points[i2].y - dm_out_y;

                // Add indexes
                _IdxWritePtr[0]  = (ImDrawIdx)(idx2+1); _IdxWritePtr[1]  = (ImDrawIdx)(idx1+1); _IdxWritePtr[2]  = (ImDrawIdx)(idx1+2);
                _IdxWritePtr[3]  = (ImDrawIdx)(idx1+2); _IdxWritePtr[4]  = (ImDrawIdx)(idx2+2); _IdxWritePtr[5]  = (ImDrawIdx)(idx2+1);
                _IdxWritePtr[6]  = (ImDrawIdx)(idx2+1); _IdxWritePtr[7]  = (ImDrawIdx)(idx1+1); _IdxWritePtr[8]  = (ImDrawIdx)(idx1+0);
                _IdxWritePtr[9]  = (ImDrawIdx)(idx1+0); _IdxWritePtr[10] = (ImDrawIdx)(idx2+0); _IdxWritePtr[11] = (ImDrawIdx)(idx2+1);
                _IdxWritePtr[12] = (ImDrawIdx)(idx2+2); _IdxWritePtr[13] = (ImDrawIdx)(idx1+2); _IdxWritePtr[14] = (ImDrawIdx)(idx1+3);
                _IdxWritePtr[15] = (ImDrawIdx)(idx1+3); _IdxWritePtr[16] = (ImDrawIdx)(idx2+3); _IdxWritePtr[17] = (ImDrawIdx)(idx2+2);
                _IdxWritePtr += 18;

                idx1 = idx2;
            }

            // Add vertexes
            for (int i = 0; i < points_count; i++)
            {
                _VtxWritePtr[0].pos = temp_points[i*4+0]; _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col_trans;
                _VtxWritePtr[1].pos = temp_points[i*4+1]; _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col;
                _VtxWritePtr[2].pos = temp_points[i*4+2]; _VtxWritePtr[2].uv = uv; _VtxWritePtr[2].col = col;
                _VtxWritePtr[3].pos = temp_points[i*4+3]; _VtxWritePtr[3].uv = uv; _VtxWritePtr[3].col = col_trans;
                _VtxWritePtr += 4;
            }
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
    else
    {
        // Non Anti-aliased Stroke
        const int idx_count = count*6;
        const int vtx_count = count*4;      // FIXME-OPT: Not sharing edges
        PrimReserve(idx_count, vtx_count);

        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1+1) == points_count ? 0 : i1+1;
            const ImVec2& p1 = points[i1];
            const ImVec2& p2 = points[i2];

            float dx = p2.x - p1.x;
            float dy = p2.y - p1.y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            dx *= (thickness * 0.5f);
            dy *= (thickness * 0.5f);

            _VtxWritePtr[0].pos.x = p1.x + dy; _VtxWritePtr[0].pos.y = p1.y - dx; _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr[1].pos.x = p2.x + dy; _VtxWritePtr[1].pos.y = p2.y - dx; _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col;
            _VtxWritePtr[2].pos.x = p2.x - dy; _VtxWritePtr[2].pos.y = p2.y + dx; _VtxWritePtr[2].uv = uv; _VtxWritePtr[2].col = col;
            _VtxWritePtr[3].pos.x = p1.x - dy; _VtxWritePtr[3].pos.y = p1.y + dx; _VtxWritePtr[3].uv = uv; _VtxWritePtr[3].col = col;
            _VtxWritePtr += 4;

            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx+1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx+2);
            _IdxWritePtr[3] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[4] = (ImDrawIdx)(_VtxCurrentIdx+2); _IdxWritePtr[5] = (ImDrawIdx)(_VtxCurrentIdx+3);
            _IdxWritePtr += 6;
            _VtxCurrentIdx += 4;
        }
    }
}